

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  Allocator *pAVar3;
  int k;
  int iVar4;
  Layer *pLVar5;
  ulong uVar6;
  int i;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  Option *pOVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  undefined4 *puVar17;
  int iVar18;
  ulong uVar19;
  undefined4 *puVar20;
  undefined4 *puVar21;
  int k_1;
  int _h;
  long lVar22;
  undefined4 *puVar23;
  Deconvolution_x86 *pDVar24;
  int i_00;
  ulong uVar25;
  ParamDict pd;
  ParamDict pd_5;
  Mat local_148;
  ulong local_f8;
  ParamDict local_f0;
  void *local_e0;
  Mat local_d8;
  Deconvolution_x86 *local_88;
  ulong local_80;
  int local_74;
  Option *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  long local_48;
  ModelBinFromMatArray local_40;
  
  if ((this->super_Deconvolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Deconvolution).activation_type) {
  case 1:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 2:
    pLVar5 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 3:
    pLVar5 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 4:
    pLVar5 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 5:
    pLVar5 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  case 6:
    pLVar5 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_Deconvolution).activation_params.data);
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_Deconvolution).activation_params.data + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_148);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_0029b6b7;
  }
  ParamDict::~ParamDict((ParamDict *)&local_148);
LAB_0029b6b7:
  if (pLVar5 != (Layer *)0x0) {
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  }
  this->activation = pLVar5;
  uVar19 = (long)(this->super_Deconvolution).kernel_h * (long)(this->super_Deconvolution).kernel_w;
  uVar1 = (this->super_Deconvolution).num_output;
  iVar18 = (int)uVar19;
  uVar14 = (long)(this->super_Deconvolution).weight_data_size / (long)iVar18;
  uVar14 = (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
           (long)(int)uVar1;
  uVar25 = 1;
  local_f8 = 1;
  if (opt->use_packing_layout == true) {
    local_f8 = (ulong)((uint)((uVar14 & 3) == 0) * 3 + 1);
    uVar25 = (ulong)((uint)((uVar1 & 3) == 0) * 3 + 1);
  }
  _h = (int)uVar14;
  i_00 = (int)uVar25;
  local_88 = this;
  local_70 = opt;
  local_58 = uVar19;
  if (opt->use_sgemm_convolution == true) {
    pLVar5 = create_layer_cpu(0x4a);
    this->gemm = pLVar5;
    ParamDict::ParamDict(&local_f0);
    ParamDict::set(&local_f0,2,1);
    ParamDict::set(&local_f0,3,0);
    ParamDict::set(&local_f0,4,1);
    ParamDict::set(&local_f0,5,0);
    ParamDict::set(&local_f0,6,1);
    ParamDict::set(&local_f0,7,(this->super_Deconvolution).num_output * iVar18);
    ParamDict::set(&local_f0,8,0);
    ParamDict::set(&local_f0,9,_h);
    ParamDict::set(&local_f0,10,-1);
    ParamDict::set(&local_f0,0xb,0);
    ParamDict::set(&local_f0,0xc,i_00);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_f0);
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    Mat::reshape(&local_d8,&(this->super_Deconvolution).weight_data,iVar18,_h,
                 (this->super_Deconvolution).num_output,(Allocator *)0x0);
    Mat::create(&local_148,(this->super_Deconvolution).num_output * iVar18,_h,4,(Allocator *)0x0);
    pOVar11 = local_70;
    pDVar24 = local_88;
    if (0 < _h) {
      local_e0 = local_148.data;
      local_f8 = (long)local_148.w *
                 CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      iVar18 = (local_88->super_Deconvolution).num_output;
      local_80 = uVar14 & 0xffffffff;
      uVar14 = uVar19 & 0xffffffff;
      uVar16 = 0;
      do {
        if (i_00 <= iVar18) {
          puVar23 = (undefined4 *)
                    (CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar16 *
                     (long)local_d8.w + (long)local_d8.data);
          lVar10 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          puVar17 = (undefined4 *)(local_f8 * uVar16 + (long)local_148.data);
          lVar22 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar6 = 0;
              uVar19 = uVar25;
              puVar12 = puVar23;
              puVar21 = puVar23;
              do {
                do {
                  *puVar17 = *puVar12;
                  puVar17 = puVar17 + 1;
                  uVar19 = uVar19 - 1;
                  puVar12 = (undefined4 *)((long)puVar12 + lVar10);
                } while (uVar19 != 0);
                uVar6 = uVar6 + 1;
                puVar12 = puVar21 + 1;
                uVar19 = uVar25;
                puVar21 = puVar12;
              } while (uVar6 != uVar14);
            }
            lVar22 = lVar22 + uVar25;
            puVar23 = (undefined4 *)((long)puVar23 + lVar10 * uVar25);
            uVar19 = local_58;
          } while (lVar22 < (long)((long)iVar18 - (ulong)(i_00 - 1)));
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_80);
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_d8.data = local_148.data;
    local_d8.refcount._0_4_ = local_148.refcount._0_4_;
    local_d8.refcount._4_4_ = local_148.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_148.elemsize;
    local_d8.elemsize._4_4_ = local_148.elemsize._4_4_;
    local_d8.elempack = local_148.elempack;
    local_d8.allocator = local_148.allocator;
    local_d8.dims = local_148.dims;
    local_d8.w = local_148.w;
    local_d8.h = local_148.h;
    local_d8.d = local_148.d;
    local_d8.c = local_148.c;
    local_d8.cstep = local_148.cstep;
    pLVar5 = pDVar24->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*pDVar24->gemm->_vptr_Layer[4])(pDVar24->gemm,pOVar11);
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    ParamDict::~ParamDict(&local_f0);
  }
  else {
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    iVar9 = 0;
    Mat::create(&local_148,(this->super_Deconvolution).weight_data.w,4,(Allocator *)0x0);
    iVar15 = (this->super_Deconvolution).num_output;
    iVar4 = iVar15 * _h;
    uVar16 = uVar19 & 0xffffffff;
    if (0 < iVar4) {
      pvVar7 = (this->super_Deconvolution).weight_data.data;
      puVar17 = (undefined4 *)((long)local_148.data + uVar19 * 4 + -4);
      do {
        if (0 < iVar18) {
          uVar6 = 0;
          puVar23 = puVar17;
          do {
            *puVar23 = *(undefined4 *)((long)pvVar7 + uVar6 * 4);
            uVar6 = uVar6 + 1;
            puVar23 = puVar23 + -1;
          } while (uVar16 != uVar6);
        }
        iVar9 = iVar9 + 1;
        pvVar7 = (void *)((long)pvVar7 + uVar19 * 4);
        puVar17 = puVar17 + uVar19;
      } while (iVar9 != iVar4);
    }
    Mat::reshape(&local_d8,&local_148,iVar18,_h,iVar15,(Allocator *)0x0);
    iVar15 = (int)local_f8 * i_00;
    Mat::create(&this->weight_data_tm,iVar18,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                     (long)(int)local_f8),(this->super_Deconvolution).num_output / i_00,
                (ulong)(uint)(iVar15 * 4),iVar15,(Allocator *)0x0);
    pOVar11 = local_70;
    pDVar24 = local_88;
    iVar18 = (this->super_Deconvolution).num_output;
    local_60 = (long)iVar18;
    if (i_00 <= iVar18) {
      local_48 = (local_88->weight_data_tm).cstep * (local_88->weight_data_tm).elemsize;
      local_50 = (local_88->weight_data_tm).data;
      uVar14 = local_f8 & 0xffffffff;
      local_80 = (long)_h - (ulong)((int)local_f8 - 1);
      local_60 = local_60 - (ulong)(i_00 - 1);
      local_e0 = (void *)0x0;
      do {
        if ((int)local_f8 <= _h) {
          puVar17 = (undefined4 *)
                    ((((ulong)local_e0 & 0xffffffff) / uVar25) * local_48 + (long)local_50);
          lVar22 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          puVar23 = (undefined4 *)(lVar22 * (long)local_e0 + (long)local_d8.data);
          lVar10 = (long)local_d8.w *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          lVar13 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar19 = 0;
              puVar12 = puVar23;
              do {
                uVar8 = 0;
                puVar21 = puVar12;
                uVar6 = uVar25;
                puVar20 = puVar12;
                do {
                  do {
                    *puVar17 = *puVar21;
                    puVar17 = puVar17 + 1;
                    uVar6 = uVar6 - 1;
                    puVar21 = (undefined4 *)((long)puVar21 + lVar22);
                  } while (uVar6 != 0);
                  uVar8 = uVar8 + 1;
                  puVar21 = (undefined4 *)((long)puVar20 + lVar10);
                  uVar6 = uVar25;
                  puVar20 = puVar21;
                } while (uVar8 != uVar14);
                uVar19 = uVar19 + 1;
                puVar12 = puVar12 + 1;
              } while (uVar19 != uVar16);
            }
            lVar13 = lVar13 + uVar14;
            puVar23 = (undefined4 *)((long)puVar23 + lVar10 * uVar14);
            uVar19 = local_58;
          } while (lVar13 < (long)local_80);
        }
        local_e0 = (void *)((long)local_e0 + uVar25);
        local_74 = _h;
      } while ((long)local_e0 < local_60);
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    local_68 = uVar25;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
  }
  if (pOVar11->lightmode == true) {
    piVar2 = (pDVar24->super_Deconvolution).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar7 = (pDVar24->super_Deconvolution).weight_data.data;
        pAVar3 = (pDVar24->super_Deconvolution).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (pDVar24->super_Deconvolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&(pDVar24->super_Deconvolution).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(pDVar24->super_Deconvolution).weight_data.elemsize + 4) = 0;
    (pDVar24->super_Deconvolution).weight_data.data = (void *)0x0;
    (pDVar24->super_Deconvolution).weight_data.refcount = (int *)0x0;
    (pDVar24->super_Deconvolution).weight_data.dims = 0;
    (pDVar24->super_Deconvolution).weight_data.w = 0;
    (pDVar24->super_Deconvolution).weight_data.h = 0;
    (pDVar24->super_Deconvolution).weight_data.d = 0;
    (pDVar24->super_Deconvolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}